

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O0

int __thiscall CVmFormatterDisp::init(CVmFormatterDisp *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  
  CVmFormatter::init(&this->super_CVmFormatter,ctx);
  iVar2 = (*(this->super_CVmFormatter)._vptr_CVmFormatter[0xf])();
  *(ushort *)&(this->super_CVmFormatter).field_0xef81 =
       *(ushort *)&(this->super_CVmFormatter).field_0xef81 & 0xffbf | ((ushort)iVar2 & 1) << 6;
  uVar1 = *(ushort *)&(this->super_CVmFormatter).field_0xef81 >> 6 & 1;
  uVar3 = (uint)uVar1;
  if (uVar1 != 0) {
    uVar3 = (*(this->super_CVmFormatter)._vptr_CVmFormatter[3])();
  }
  return uVar3;
}

Assistant:

void init()
    {
        /* inherit base class initialization */
        CVmFormatter::init();

        /* 
         *   if we're compiled for HTML mode, set the standard output
         *   stream so that it knows it has an HTML target - this will
         *   ensure that HTML tags are passed through to the underlying
         *   stream, and that we generate HTML equivalents for our own
         *   control sequences 
         */ 
        html_target_ = get_init_html_target();

        /* 
         *   since we always use HTML mode, turn on HTML mode in the
         *   underlying OS window if our underlying OS renderer is HTML-aware
         */
        if (html_target_)
            start_html_in_os();
    }